

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_helper-inl.h
# Opt level: O0

tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* spdlog::details::file_helper::split_by_extension(filename_t *fname)

{
  long lVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  size_type folder_index;
  size_type ext_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  string local_b0 [32];
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  ulong local_50;
  string local_38 [32];
  long local_18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_10;
  
  local_10 = in_RSI;
  lVar1 = std::__cxx11::string::rfind((char)in_RSI,0x2e);
  local_18 = lVar1;
  if (((lVar1 != -1) && (lVar1 != 0)) && (lVar2 = std::__cxx11::string::size(), lVar1 != lVar2 + -1)
     ) {
    local_50 = std::__cxx11::string::find_last_of((char *)local_10,0x255dac);
    if ((local_50 != 0xffffffffffffffff) && (local_18 - 1U <= local_50)) {
      __args_1 = &local_70;
      std::__cxx11::string::string((string *)__args_1);
      std::make_tuple<std::__cxx11::string_const&,std::__cxx11::string>
                (in_stack_ffffffffffffff28,__args_1);
      std::__cxx11::string::~string((string *)&local_70);
      return in_RDI;
    }
    std::__cxx11::string::substr((ulong)local_90,(ulong)local_10);
    std::__cxx11::string::substr((ulong)local_b0,(ulong)local_10);
    std::make_tuple<std::__cxx11::string,std::__cxx11::string>
              (in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
    std::__cxx11::string::~string(local_b0);
    std::__cxx11::string::~string(local_90);
    return in_RDI;
  }
  std::__cxx11::string::string(local_38);
  std::make_tuple<std::__cxx11::string_const&,std::__cxx11::string>
            (local_10,in_stack_ffffffffffffff20);
  std::__cxx11::string::~string(local_38);
  return in_RDI;
}

Assistant:

SPDLOG_INLINE std::tuple<filename_t, filename_t> file_helper::split_by_extension(const filename_t &fname)
{
    auto ext_index = fname.rfind('.');

    // no valid extension found - return whole path and empty string as
    // extension
    if (ext_index == filename_t::npos || ext_index == 0 || ext_index == fname.size() - 1)
    {
        return std::make_tuple(fname, filename_t());
    }

    // treat cases like "/etc/rc.d/somelogfile or "/abc/.hiddenfile"
    auto folder_index = fname.find_last_of(details::os::folder_seps_filename);
    if (folder_index != filename_t::npos && folder_index >= ext_index - 1)
    {
        return std::make_tuple(fname, filename_t());
    }

    // finally - return a valid base and extension tuple
    return std::make_tuple(fname.substr(0, ext_index), fname.substr(ext_index));
}